

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool_extension.cpp
# Opt level: O0

bool __thiscall
dlib::thread_pool_implementation::is_worker_thread
          (thread_pool_implementation *this,thread_id_type id)

{
  size_t sVar1;
  unsigned_long *puVar2;
  unsigned_long in_RSI;
  array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_RDI;
  unsigned_long i;
  ulong local_20;
  
  local_20 = 0;
  while( true ) {
    sVar1 = array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::size
                      ((array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *)
                       (in_RDI + 1));
    if (sVar1 <= local_20) {
      sVar1 = array<dlib::thread_pool_implementation::task_state_type,_dlib::memory_manager_stateless_kernel_1<char>_>
              ::size(in_RDI);
      return sVar1 == 0;
    }
    puVar2 = array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_>::operator[]
                       ((array<unsigned_long,_dlib::memory_manager_stateless_kernel_1<char>_> *)
                        (in_RDI + 1),local_20);
    if (*puVar2 == in_RSI) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool thread_pool_implementation::
    is_worker_thread (
        const thread_id_type id
    ) const
    {
        for (unsigned long i = 0; i < worker_thread_ids.size(); ++i)
        {
            if (worker_thread_ids[i] == id)
                return true;
        }

        // if there aren't any threads in the pool then we consider all threads
        // to be worker threads
        if (tasks.size() == 0)
            return true;
        else
            return false;
    }